

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotDiff.cpp
# Opt level: O3

void __thiscall OpenMD::PotDiff::writeDiff(PotDiff *this)

{
  size_t sVar1;
  char cVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  ofstream ofs;
  undefined4 local_248;
  undefined4 uStack_244;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"PotDiff: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    dVar6 = (this->data_).Avg_;
    dVar7 = (this->data_).Avg2_;
    sVar1 = (this->data_).Count_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#potDiff\n",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#selection: (",0xd);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_230,(this->selectionScript_)._M_dataplus._M_p,
                        (this->selectionScript_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# <diff> = ",0xb);
    poVar3 = std::ostream::_M_insert<double>(dVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# StdDev = ",0xb);
    dVar7 = dVar7 - dVar6 * dVar6;
    dVar6 = 0.0;
    if (0.0 <= dVar7) {
      dVar6 = dVar7;
    }
    poVar3 = std::ostream::_M_insert<double>(SQRT(dVar6));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# 95% confidence interval = ",0x1c);
    local_248 = (undefined4)sVar1;
    uStack_244 = (undefined4)(sVar1 >> 0x20);
    poVar3 = std::ostream::_M_insert<double>
                       ((SQRT(dVar6) * 1.96) /
                        SQRT(((double)CONCAT44(0x45300000,uStack_244) - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,local_248) - 4503599627370496.0)));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# t\tdiff[t]\n",0xc);
    if ((this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->diff_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        poVar3 = std::ostream::_M_insert<double>
                           ((this->times_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
        poVar3 = std::ostream::_M_insert<double>
                           ((this->diff_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar5 < (ulong)((long)(this->diff_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->diff_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void PotDiff::writeDiff() {
    std::ofstream ofs(outputFilename_.c_str(), std::ios::binary);
    if (ofs.is_open()) {
      RealType mu    = data_.getAverage();
      RealType sigma = data_.getStdDev();
      RealType m95   = data_.get95percentConfidenceInterval();

      ofs << "#potDiff\n";
      ofs << "#selection: (" << selectionScript_ << ")\n";
      ofs << "# <diff> = " << mu << "\n";
      ofs << "# StdDev = " << sigma << "\n";
      ofs << "# 95% confidence interval = " << m95 << "\n";
      ofs << "# t\tdiff[t]\n";
      for (unsigned int i = 0; i < diff_.size(); ++i) {
        ofs << times_[i] << "\t" << diff_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "PotDiff: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }
    ofs.close();
  }